

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void ps_lattice_compute_lscr(ps_seg_t *seg,ps_latlink_t *link,int to)

{
  ngram_model_t *model;
  int iVar1;
  int32 iVar2;
  ngram_model_t *lmset;
  int to_local;
  ps_latlink_t *link_local;
  ps_seg_t *seg_local;
  
  iVar1 = strcmp(seg->search->type,"ngram");
  if (iVar1 == 0) {
    model = (ngram_model_t *)seg->search[1].vt;
    if (link->best_prev == (ps_latlink_s *)0x0) {
      if (to == 0) {
        seg->lscr = 0;
        seg->lback = 1;
      }
      else {
        iVar2 = ngram_bg_score(model,link->to->basewid,link->from->basewid,&seg->lback);
        seg->lscr = iVar2 >> 10;
      }
    }
    else if (to == 0) {
      if (link->best_prev->best_prev == (ps_latlink_s *)0x0) {
        iVar2 = ngram_bg_score(model,link->from->basewid,link->best_prev->from->basewid,&seg->lback)
        ;
        seg->lscr = iVar2 >> 10;
      }
      else {
        iVar2 = ngram_tg_score(model,link->from->basewid,link->best_prev->from->basewid,
                               link->best_prev->best_prev->from->basewid,&seg->lback);
        seg->lscr = iVar2 >> 10;
      }
    }
    else {
      iVar2 = ngram_tg_score(model,link->to->basewid,link->from->basewid,
                             link->best_prev->from->basewid,&seg->lback);
      seg->lscr = iVar2 >> 10;
    }
  }
  else {
    seg->lback = 1;
    seg->lscr = 0;
  }
  return;
}

Assistant:

static void
ps_lattice_compute_lscr(ps_seg_t *seg, ps_latlink_t *link, int to)
{
    ngram_model_t *lmset;

    /* Language model score is included in the link score for FSG
     * search.  FIXME: Of course, this is sort of a hack :( */
    if (0 != strcmp(ps_search_type(seg->search), PS_SEARCH_TYPE_NGRAM)) {
        seg->lback = 1; /* Unigram... */
        seg->lscr = 0;
        return;
    }
        
    lmset = ((ngram_search_t *)seg->search)->lmset;

    if (link->best_prev == NULL) {
        if (to) /* Sentence has only two words. */
            seg->lscr = ngram_bg_score(lmset, link->to->basewid,
                                       link->from->basewid, &seg->lback)
                >> SENSCR_SHIFT;
        else {/* This is the start symbol, its lscr is always 0. */
            seg->lscr = 0;
            seg->lback = 1;
        }
    }
    else {
        /* Find the two predecessor words. */
        if (to) {
            seg->lscr = ngram_tg_score(lmset, link->to->basewid,
                                       link->from->basewid,
                                       link->best_prev->from->basewid,
                                       &seg->lback) >> SENSCR_SHIFT;
        }
        else {
            if (link->best_prev->best_prev)
                seg->lscr = ngram_tg_score(lmset, link->from->basewid,
                                           link->best_prev->from->basewid,
                                           link->best_prev->best_prev->from->basewid,
                                           &seg->lback) >> SENSCR_SHIFT;
            else
                seg->lscr = ngram_bg_score(lmset, link->from->basewid,
                                           link->best_prev->from->basewid,
                                           &seg->lback) >> SENSCR_SHIFT;
        }
    }
}